

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedCollator::getRules
          (RuleBasedCollator *this,UColRuleOption delta,UnicodeString *buffer)

{
  ushort uVar1;
  ushort uVar2;
  UnicodeString *this_00;
  
  if (delta != UCOL_TAILORING_ONLY) {
    uVar1 = (buffer->fUnion).fStackFields.fLengthAndFlags;
    uVar2 = 2;
    if ((uVar1 & 1) == 0) {
      uVar2 = uVar1 & 0x1e;
    }
    (buffer->fUnion).fStackFields.fLengthAndFlags = uVar2;
    CollationLoader::appendRootRules(buffer);
    this_00 = UnicodeString::append(buffer,&this->tailoring->rules);
    UnicodeString::getTerminatedBuffer(this_00);
    return;
  }
  UnicodeString::operator=(buffer,&this->tailoring->rules);
  return;
}

Assistant:

void
RuleBasedCollator::getRules(UColRuleOption delta, UnicodeString &buffer) const {
    if(delta == UCOL_TAILORING_ONLY) {
        buffer = tailoring->rules;
        return;
    }
    // UCOL_FULL_RULES
    buffer.remove();
    CollationLoader::appendRootRules(buffer);
    buffer.append(tailoring->rules).getTerminatedBuffer();
}